

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setTipStates
          (BeagleCPUImpl<double,_1,_0> *this,int tipIndex,int *inStates)

{
  void *pvVar1;
  BeagleCPUImpl<double,_1,_0> *in_RDX;
  int in_ESI;
  long in_RDI;
  int j_1;
  int j;
  undefined4 local_34;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar2;
  int local_4;
  
  if ((in_ESI < 0) || (*(int *)(in_RDI + 0x10) <= in_ESI)) {
    local_4 = -5;
  }
  else {
    pvVar1 = mallocAligned(in_RDX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    *(void **)(*(long *)(in_RDI + 0xb8) + (long)in_ESI * 8) = pvVar1;
    for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x14); iVar2 = iVar2 + 1) {
      if (*(int *)((long)&(in_RDX->super_BeagleImpl)._vptr_BeagleImpl + (long)iVar2 * 4) <
          *(int *)(in_RDI + 0x24)) {
        local_34 = *(undefined4 *)
                    ((long)&(in_RDX->super_BeagleImpl)._vptr_BeagleImpl + (long)iVar2 * 4);
      }
      else {
        local_34 = *(undefined4 *)(in_RDI + 0x24);
      }
      *(undefined4 *)(*(long *)(*(long *)(in_RDI + 0xb8) + (long)in_ESI * 8) + (long)iVar2 * 4) =
           local_34;
    }
    for (iVar2 = *(int *)(in_RDI + 0x14); iVar2 < *(int *)(in_RDI + 0x18); iVar2 = iVar2 + 1) {
      *(undefined4 *)(*(long *)(*(long *)(in_RDI + 0xb8) + (long)in_ESI * 8) + (long)iVar2 * 4) =
           *(undefined4 *)(in_RDI + 0x24);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTipStates(int tipIndex,
                                const int* inStates) {
    if (tipIndex < 0 || tipIndex >= kTipCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    gTipStates[tipIndex] = (int*) mallocAligned(sizeof(int) * kPaddedPatternCount);
    // TODO: What if this throws a memory full error?
    for (int j = 0; j < kPatternCount; j++) {
        gTipStates[tipIndex][j] = (inStates[j] < kStateCount ? inStates[j] : kStateCount);
    }
    for (int j = kPatternCount; j < kPaddedPatternCount; j++) {
        gTipStates[tipIndex][j] = kStateCount;
    }

    return BEAGLE_SUCCESS;
}